

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_archive.cpp
# Opt level: O3

bool ON_SubDVertex::Read(ON_BinaryArchive *archive,ON_SubD *subd,ON_SubDVertex **vertex)

{
  bool bVar1;
  ON_SubDVertexTag vertex_tag_00;
  uint level;
  int iVar2;
  ON_SubDimple *this;
  ON_SubDVertex *pOVar3;
  long lVar4;
  ON_SubDComponentBase *pOVar5;
  ON_SubDComponentBase *pOVar6;
  ON_SubDVertex *pOVar7;
  byte bVar8;
  unsigned_short face_count;
  uchar vertex_tag;
  unsigned_short edge_count;
  uchar sz;
  double P [3];
  ON_SubDComponentBase base;
  ON__UINT16 local_a0;
  byte local_9d;
  ON__UINT16 local_9c;
  ON__UINT8 local_99;
  double local_98 [3];
  ON_SubDComponentBase local_80;
  
  bVar8 = 0;
  *vertex = (ON_SubDVertex *)0x0;
  this = ON_SubD::SubDimple(subd);
  if (this != (ON_SubDimple *)0x0) {
    pOVar5 = &ON_SubDComponentBase::Unset;
    pOVar6 = &local_80;
    for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
      pOVar6->m_subd_point1 = pOVar5->m_subd_point1;
      pOVar5 = (ON_SubDComponentBase *)((long)pOVar5 + ((ulong)bVar8 * -2 + 1) * 8);
      pOVar6 = (ON_SubDComponentBase *)((long)pOVar6 + (ulong)bVar8 * -0x10 + 8);
    }
    local_9d = 0;
    local_9c = 0;
    local_a0 = 0;
    bVar1 = ReadBase(archive,&local_80);
    if ((bVar1) && (bVar1 = ON_BinaryArchive::ReadChar(archive,&local_9d), bVar1)) {
      bVar1 = ON_BinaryArchive::ReadDouble(archive,3,local_98);
      if (bVar1) {
        bVar1 = ON_BinaryArchive::ReadShort(archive,&local_9c);
        if (((bVar1) && (bVar1 = ON_BinaryArchive::ReadShort(archive,&local_a0), bVar1)) &&
           (bVar1 = Internal_IgnoreSavedLimitPointList(archive,(uint)local_a0), bVar1)) {
          vertex_tag_00 = ON_SubD::VertexTagFromUnsigned((uint)local_9d);
          level = ON_SubDComponentBase::SubdivisionLevel(&local_80);
          pOVar3 = ON_SubDimple::AllocateVertex
                             (this,local_80.m_id,vertex_tag_00,level,local_98,(uint)local_9c,
                              (uint)local_a0);
          if (pOVar3 != (ON_SubDVertex *)0x0) {
            pOVar5 = &local_80;
            pOVar7 = pOVar3;
            for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
              (pOVar7->super_ON_SubDComponentBase).m_subd_point1 = pOVar5->m_subd_point1;
              pOVar5 = (ON_SubDComponentBase *)((long)pOVar5 + ((ulong)bVar8 * -2 + 1) * 8);
              pOVar7 = (ON_SubDVertex *)((long)pOVar7 + (ulong)bVar8 * -0x10 + 8);
            }
            bVar1 = Internal_ReadEdgePtrList
                              (archive,&local_9c,pOVar3->m_edge_capacity,pOVar3->m_edges,0,
                               (ON_SubDEdgePtr *)0x0);
            if (bVar1) {
              pOVar3->m_edge_count = local_9c;
              bVar1 = Internal_ReadFacePtrList
                                (archive,&local_a0,pOVar3->m_face_capacity,
                                 (ON_SubDFacePtr *)pOVar3->m_faces,0,(ON_SubDFacePtr *)0x0);
              if (bVar1) {
                pOVar3->m_face_count = local_a0;
                *vertex = pOVar3;
                iVar2 = ON_BinaryArchive::Archive3dmVersion(archive);
                if (0x45 < iVar2) {
                  bVar1 = Internal_FinishReadingComponentAdditions(archive);
                  return bVar1;
                }
                local_99 = '\x01';
                bVar1 = ON_BinaryArchive::ReadChar(archive,&local_99);
                if ((bVar1) && (local_99 == '\0')) {
                  return true;
                }
              }
            }
          }
        }
      }
      else {
        ON_SubDIncrementErrorCount();
      }
    }
  }
  ON_SubDIncrementErrorCount();
  return false;
}

Assistant:

bool ON_SubDVertex::Read(
  class ON_BinaryArchive& archive,
  class ON_SubD& subd,
  class ON_SubDVertex*& vertex
  )
{
  vertex = nullptr;

  for (;;)
  {
    ON_SubDimple* subdimple = const_cast<ON_SubDimple*>(subd.SubDimple());
    if ( nullptr == subdimple)
      break;

    ON_SubDComponentBase base = ON_SubDComponentBase::Unset;
    unsigned char vertex_tag = 0;
    //unsigned char vertex_edge_order = 0;
    //unsigned char vertex_facet_type = 0;
    double P[3];
    unsigned short edge_count = 0;
    unsigned short face_count = 0;

    //ON_SimpleArray<ON_SubDSectorSurfacePoint> limit_points;

    if (!ReadBase(archive,base))
      break;
    if (!archive.ReadChar(&vertex_tag))
      break;
    if (!Internal_ReadDouble3(archive,P))
      break;
    if (!archive.ReadShort(&edge_count))
      break;
    if (!archive.ReadShort(&face_count))
      break;

    if (!Internal_IgnoreSavedLimitPointList(archive, face_count))
      break;

    ON_SubDVertex* v = subdimple->AllocateVertex(
      base.m_id, // serialization must preserve ON_SubDVertex.m_id
      ON_SubD::VertexTagFromUnsigned(vertex_tag),
      base.SubdivisionLevel(),
      P,
      edge_count,
      face_count
      );

    if ( nullptr == v )
      break;

    v->ON_SubDComponentBase::operator=(base);

    if (!Internal_ReadEdgePtrList(archive,edge_count,v->m_edge_capacity,v->m_edges,0,nullptr))
      break;
    v->m_edge_count = edge_count;

    if (!Internal_ReadFacePtrList(archive,face_count,v->m_face_capacity,(ON_SubDFacePtr*)v->m_faces,0,nullptr))
      break;
    v->m_face_count = face_count;

    //for (unsigned int i = 0; i < limit_points.UnsignedCount(); i++)
    //{
    //  ON_SubDSectorSurfacePoint limit_point = limit_points[i];
    //  limit_point.m_next_sector_limit_point = (const ON_SubDSectorSurfacePoint*)1U; // skips checks
    //  if (false == v->SetSavedSurfacePoint( true, limit_point))
    //  {
    //    v->ClearSavedSurfacePoints();
    //    break;
    //  }
    //}

    vertex = v;

    if (archive.Archive3dmVersion() < 70)
    {
      unsigned char sz = 1;
      if (!archive.ReadChar(&sz) || 0 != sz)
        break;
      return true;
    }

    // read additions
    return Internal_FinishReadingComponentAdditions(archive);
  }
  return ON_SUBD_RETURN_ERROR(false);
}